

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall StringFixture_JapaneseUTF8_Test::TestBody(StringFixture_JapaneseUTF8_Test *this)

{
  bool bVar1;
  iterator begin;
  iterator end;
  char *message;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  string actual;
  allocator local_59;
  undefined1 local_58 [8];
  string expected;
  array<unsigned_char,_27UL> chars;
  StringFixture_JapaneseUTF8_Test *this_local;
  
  expected.field_2._8_8_ = 0x82e3af81e38a81e3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_58,
             "\"\\xE3\\x81\\x8A\\xE3\\x81\\xAF\\xE3\\x82\\x88\\xE3\\x81\\x86\\xE3\\x81\\x94\\xE3\\x81\\x96\\xE3\\x81\\x84\\xE3\\x81\\xBE\\xE3\\x81\\x99\""
             ,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  begin = std::begin<std::array<unsigned_char,27ul>>
                    ((array<unsigned_char,_27UL> *)((long)&expected.field_2 + 8));
  end = std::end<std::array<unsigned_char,27ul>>
                  ((array<unsigned_char,_27UL> *)((long)&expected.field_2 + 8));
  (anonymous_namespace)::StringFixture::convert<unsigned_char*>
            ((string *)&gtest_ar.message_,this,begin,end);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_a0,"expected","actual",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_string.cpp"
               ,0x91,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

TEST_F (StringFixture, JapaneseUTF8) {
    std::array<std::uint8_t, 9 * 3> chars{{
        0xE3, 0x81, 0x8A, // HIRAGANA LETTER O
        0xE3, 0x81, 0xAF, // HIRAGANA LETTER HA
        0xE3, 0x82, 0x88, // HIRAGANA LETTER YO
        0xE3, 0x81, 0x86, // HIRAGANA LETTER U
        0xE3, 0x81, 0x94, // HIRAGANA LETTER GO
        0xE3, 0x81, 0x96, // HIRAGANA LETTER ZA
        0xE3, 0x81, 0x84, // HIRAGANA LETTER I
        0xE3, 0x81, 0xBE, // HIRAGANA LETTER MA
        0xE3, 0x81, 0x99, // HIRAGANA LETTER SU
    }};

    std::string const expected = "\""
                                 "\\xE3\\x81\\x8A"
                                 "\\xE3\\x81\\xAF"
                                 "\\xE3\\x82\\x88"
                                 "\\xE3\\x81\\x86"
                                 "\\xE3\\x81\\x94"
                                 "\\xE3\\x81\\x96"
                                 "\\xE3\\x81\\x84"
                                 "\\xE3\\x81\\xBE"
                                 "\\xE3\\x81\\x99"
                                 "\"";

    std::string actual = this->convert (std::begin (chars), std::end (chars));
    EXPECT_EQ (expected, actual);
}